

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitCall(ParseNodeCall *pnodeCall,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
             BOOL fReturnValue,BOOL fEvaluateComponents,RegSlot overrideThisLocation,
             RegSlot newTargetLocation)

{
  undefined1 *puVar1;
  ProfileId PVar2;
  ParseNode *pPVar3;
  ParseNode *pnode;
  code *pcVar4;
  FuncInfo *pFVar5;
  RegSlot thisLocation_00;
  ProfileId PVar6;
  bool bVar7;
  uint uVar8;
  undefined4 *puVar9;
  RegSlot thisLocation_01;
  BOOL BVar10;
  uint uVar11;
  uint uVar12;
  AuxArray<unsigned_int> *local_98;
  AuxArray<unsigned_int> *spreadIndices;
  uint local_84;
  FuncInfo *local_80;
  ParseNode *local_78;
  ulong local_70;
  ParseNodeCall *local_68;
  BOOL local_60;
  BOOL local_5c;
  BOOL fSideEffectArgs;
  uint16 local_52;
  ByteCodeGenerator *local_50;
  RegSlot local_44;
  RegSlot local_40;
  RegSlot thisLocation;
  RegSlot callObjLocation;
  ProfileId local_34;
  bool local_31 [3];
  ProfileId callApplyCallSiteId;
  ProfileId callSiteId;
  bool releaseThisLocation;
  BOOL *pSideEffect;
  
  local_68 = (ParseNodeCall *)CONCAT44(local_68._4_4_,overrideThisLocation);
  local_44 = 0xffffffff;
  local_40 = 0xffffffff;
  local_60 = 0;
  local_70 = CONCAT71(local_70._1_7_,pnodeCall->field_0x24);
  pPVar3 = pnodeCall->pnodeTarget;
  pnode = pnodeCall->pnodeArgs;
  local_52 = pnodeCall->spreadArgCount;
  local_80 = funcInfo;
  local_5c = fEvaluateComponents;
  local_50 = byteCodeGenerator;
  thisLocation = fReturnValue;
  bVar7 = CreateNativeArrays(byteCodeGenerator,funcInfo);
  if (bVar7) {
    CallTargetIsArray(pPVar3);
  }
  pSideEffect = &local_60;
  spreadIndices = (AuxArray<unsigned_int> *)pPVar3;
  local_78 = pnode;
  uVar8 = CountArguments(pnode,pSideEffect);
  pFVar5 = local_80;
  BVar10 = (BOOL)pSideEffect;
  uVar11 = (uint)(newTargetLocation != 0xffffffff);
  local_84 = *(uint *)&pnodeCall->field_0x24 >> 2 & 1;
  uVar12 = uVar11;
  if (local_84 != 0) {
    if (newTargetLocation != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      BVar10 = 0x214d;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x214d,"(!fHasNewTarget)","!fHasNewTarget");
      if (!bVar7) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar9 = 0;
    }
    uVar12 = (uint)(1 < uVar8);
  }
  uVar12 = uVar12 + uVar8;
  uVar8 = uVar8 & 0xffff;
  if (uVar12 < uVar8) {
    Js::Throw::OutOfMemory();
  }
  if (thisLocation != 0) {
    puVar1 = &(pnodeCall->super_ParseNode).field_0x1;
    *puVar1 = *puVar1 | 1;
  }
  local_31[0] = true;
  callObjLocation._2_2_ = -1;
  thisLocation = uVar8;
  if ((local_70 & 8) == 0) {
    if (local_5c == 0) {
      EmitCallTargetNoEvalComponents
                ((ParseNode *)spreadIndices,BVar10,&local_44,local_31,&local_40,local_50,pFVar5);
    }
    else {
      EmitCallTarget((ParseNode *)spreadIndices,local_60,&local_44,local_31,&local_40,local_50,
                     pFVar5,(ProfileId *)((long)&callObjLocation + 2));
    }
  }
  if ((RegSlot)local_68 != 0xffffffff) {
    local_44 = (RegSlot)local_68;
    local_31[0] = false;
  }
  FuncInfo::StartRecordingOutArgs(pFVar5,uVar12);
  local_34 = ByteCodeGenerator::GetNextCallSiteId(local_50,CallI);
  fSideEffectArgs = uVar11;
  if (callObjLocation._2_2_ != -1) {
    JsUtil::
    BaseDictionary<unsigned_short,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_short,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
              ((BaseDictionary<unsigned_short,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)pFVar5->callSiteToCallApplyCallSiteMap,&local_34,
               (unsigned_short *)((long)&callObjLocation + 2));
  }
  PVar6 = local_34;
  PVar2 = local_50->m_callSiteId;
  bVar7 = true;
  if ((pnodeCall->field_0x24 & 0x10) == 0) {
    bVar7 = Js::FunctionProxy::IsCoroutine(&local_80->byteCodeFunction->super_FunctionProxy);
    if (bVar7) {
      bVar7 = pnodeCall->pnodeArgs != (ParseNodePtr)0x0;
    }
    else {
      bVar7 = false;
    }
  }
  thisLocation_00 = local_44;
  BVar10 = local_5c;
  pPVar3 = local_78;
  pFVar5 = local_80;
  uVar8 = local_84;
  local_70 = (ulong)local_34;
  local_78 = (ParseNode *)(ulong)(uVar12 & 0xffff);
  local_68 = pnodeCall;
  EmitArgList(pPVar3,local_44,newTargetLocation,local_84,local_5c,local_50,local_80,local_34,
              (ArgSlot)uVar12,bVar7,PVar6 != PVar2,local_52,&local_98);
  if (BVar10 == 0) {
    EmitCallInstrNoEvalComponents
              (local_68,uVar8,fSideEffectArgs,thisLocation_00,local_40,thisLocation,local_50,pFVar5,
               local_34,local_98);
  }
  else {
    thisLocation_01 = 0xffffffff;
    if (local_31[0] != false) {
      thisLocation_01 = thisLocation_00;
    }
    EmitCallInstr(local_68,uVar8,fSideEffectArgs,thisLocation_01,local_40,thisLocation,local_50,
                  pFVar5,local_34,local_98);
  }
  FuncInfo::EndRecordingOutArgs(pFVar5,(ArgSlot)local_78);
  return;
}

Assistant:

void EmitCall(
    ParseNodeCall * pnodeCall,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo,
    BOOL fReturnValue,
    BOOL fEvaluateComponents,
    Js::RegSlot overrideThisLocation,
    Js::RegSlot newTargetLocation)
{
    // If the call returns a float, we'll note this in the byte code.
    Js::RegSlot thisLocation = Js::Constants::NoRegister;
    Js::RegSlot callObjLocation = Js::Constants::NoRegister;
    BOOL fHasNewTarget = newTargetLocation != Js::Constants::NoRegister;
    BOOL fSideEffectArgs = FALSE;
    BOOL fIsSuperCall = pnodeCall->isSuperCall;
    ParseNode *pnodeTarget = pnodeCall->pnodeTarget;
    ParseNode *pnodeArgs = pnodeCall->pnodeArgs;
    uint16 spreadArgCount = pnodeCall->spreadArgCount;

    if (CreateNativeArrays(byteCodeGenerator, funcInfo) && CallTargetIsArray(pnodeTarget)) {
        // some minifiers (potentially incorrectly) assume that "v = new Array()" and "v = Array()" are equivalent,
        // and replace the former with the latter to save 4 characters. What that means for us is that it, at least
        // initially, uses the "Call" path. We want to guess that it _is_ just "new Array()" and change over to the
        // "new" path, since then our native array handling can kick in.
        /*EmitNew(pnode, byteCodeGenerator, funcInfo);
        return;*/
    }

    unsigned int argCount = CountArguments(pnodeArgs, &fSideEffectArgs);

    BOOL fIsEval = pnodeCall->isEvalCall;
    Js::ArgSlot argSlotCount = (Js::ArgSlot)argCount;

    if (fIsEval)
    {
        Assert(!fHasNewTarget);

        //
        // "eval" takes the closure environment as an extra argument
        // Pass the closure env only if some argument is passed
        // For just eval(), don't pass the closure environment
        //
        if (argCount > 1)
        {
            argCount++;
        }
    }
    else if (fHasNewTarget)
    {
        // When we need to pass new.target explicitly, it is passed as an extra argument.
        // This is similar to how eval passes an extra argument for the frame display and is
        // used to support cases where we need to pass both 'this' and new.target as part of
        // a function call.
        // OpCode::LdNewTarget knows how to look at the call flags and fetch this argument.
        argCount++;
    }

    // argCount indicates the total arguments count including the extra arguments.
    // argSlotCount indicates the actual arguments count. So argCount should always never be les sthan argSlotCount.
    if (argCount < (unsigned int)argSlotCount)
    {
        Js::Throw::OutOfMemory();
    }

    if (fReturnValue)
    {
        pnodeCall->isUsed = true;
    }

    //
    // Set up the call.
    //

    bool releaseThisLocation = true;

    // We already emit the call target for super calls in EmitSuperCall
    Js::ProfileId callApplyCallSiteId = Js::Constants::NoProfileId;
    if (!fIsSuperCall)
    {
        if (!fEvaluateComponents)
        {
            EmitCallTargetNoEvalComponents(pnodeTarget, fSideEffectArgs, &thisLocation, &releaseThisLocation, &callObjLocation, byteCodeGenerator, funcInfo);
        }
        else
        {
            EmitCallTarget(pnodeTarget, fSideEffectArgs, &thisLocation, &releaseThisLocation, &callObjLocation, byteCodeGenerator, funcInfo, &callApplyCallSiteId);
        }
    }

    // If we are strictly overriding the this location, ignore what the call target set this location to.
    if (overrideThisLocation != Js::Constants::NoRegister)
    {
        thisLocation = overrideThisLocation;
        releaseThisLocation = false;
    }

    // Evaluate the arguments (nothing mode-specific here).
    // Start call, allocate out param space
    // We have to use the arguments count including the extra args to Start Call as we use it to allocated space for all the args
    funcInfo->StartRecordingOutArgs(argCount);

    Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(Js::OpCode::CallI);
    if (callApplyCallSiteId != Js::Constants::NoProfileId)
    {
        funcInfo->callSiteToCallApplyCallSiteMap->AddNew(callSiteId, callApplyCallSiteId);
    }

    // Only emit profiled argouts if we're going to allocate callSiteInfo (on the DynamicProfileInfo) for this call.
    bool emitProfiledArgouts = callSiteId != byteCodeGenerator->GetCurrentCallSiteId();

    // Emit argouts at end for generators so that we don't need to restore them when bailing in
    bool emitArgOutsAtEnd = pnodeCall->hasDestructuring || (funcInfo->byteCodeFunction->IsCoroutine() && pnodeCall->pnodeArgs != nullptr);
    Js::AuxArray<uint32> *spreadIndices;
    EmitArgList(pnodeArgs, thisLocation, newTargetLocation, fIsEval, fEvaluateComponents, byteCodeGenerator, funcInfo, callSiteId, (Js::ArgSlot)argCount, emitArgOutsAtEnd, emitProfiledArgouts, spreadArgCount, &spreadIndices);

    if (!fEvaluateComponents)
    {
        EmitCallInstrNoEvalComponents(pnodeCall, fIsEval, fHasNewTarget, thisLocation, callObjLocation, argSlotCount, byteCodeGenerator, funcInfo, callSiteId, spreadIndices);
    }
    else
    {
        EmitCallInstr(pnodeCall, fIsEval, fHasNewTarget, releaseThisLocation ? thisLocation : Js::Constants::NoRegister, callObjLocation, argSlotCount, byteCodeGenerator, funcInfo, callSiteId, spreadIndices);
    }

    // End call, pop param space
    funcInfo->EndRecordingOutArgs((Js::ArgSlot)argCount);
}